

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

Filter * helics::generateTranslator
                   (Federate *fed,bool global,string_view name,TranslatorTypes ttype,
                   string_view endpointType,string_view units)

{
  string_view units_00;
  string_view units_01;
  Filter *this;
  undefined7 in_register_00000031;
  size_t in_R9;
  string_view endpointType_00;
  string_view endpointType_01;
  
  if ((int)CONCAT71(in_register_00000031,global) == 0) {
    units_01._M_str = (char *)units._M_len;
    units_01._M_len = (size_t)endpointType._M_str;
    endpointType_01._M_str = (char *)endpointType._M_len;
    endpointType_01._M_len = in_R9;
    this = Federate::registerTranslator(fed,0,name,endpointType_01,units_01);
  }
  else {
    units_00._M_str = (char *)units._M_len;
    units_00._M_len = (size_t)endpointType._M_str;
    endpointType_00._M_str = (char *)endpointType._M_len;
    endpointType_00._M_len = in_R9;
    this = (Filter *)
           ConnectorFederateManager::registerTranslator
                     ((fed->cManager)._M_t.
                      super___uniq_ptr_impl<helics::ConnectorFederateManager,_std::default_delete<helics::ConnectorFederateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::ConnectorFederateManager_*,_std::default_delete<helics::ConnectorFederateManager>_>
                      .super__Head_base<0UL,_helics::ConnectorFederateManager_*,_false>._M_head_impl
                      ,name,endpointType_00,units_00);
    Translator::setTranslatorType((Translator *)this,0);
  }
  if (ttype != CUSTOM) {
    Translator::setTranslatorType((Translator *)this,ttype);
  }
  return this;
}

Assistant:

static Translator& generateTranslator(Federate* fed,
                                      bool global,
                                      std::string_view name,
                                      TranslatorTypes ttype,
                                      std::string_view endpointType,
                                      std::string_view units)
{
    Translator& trans = (global) ? fed->registerGlobalTranslator(name, endpointType, units) :
                                   fed->registerTranslator(name, endpointType, units);
    if (ttype != TranslatorTypes::CUSTOM) {
        trans.setTranslatorType(static_cast<std::int32_t>(ttype));
    }
    return trans;
}